

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O2

char * ODDLParser::OpenDDLParser::parseProperty(char *in,char *end,Property **prop)

{
  pointer names_00;
  pointer ppNVar1;
  Text *this;
  bool bVar2;
  char *pcVar3;
  Reference *this_00;
  Property *this_01;
  Value *primData;
  vector<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_> names;
  Text *id;
  
  *prop = (Property *)0x0;
  if (in != end && in != (char *)0x0) {
    pcVar3 = lookForNextToken<char>(in,end);
    id = (Text *)0x0;
    in = parseIdentifier(pcVar3,end,&id);
    this = id;
    if (id != (Text *)0x0) {
      in = lookForNextToken<char>(in,end);
      if (*in == '=') {
        pcVar3 = getNextToken<char>(in + 1,end);
        primData = (Value *)0x0;
        bVar2 = isInteger<char>(pcVar3,end);
        if (bVar2) {
          in = parseIntegerLiteral(pcVar3,end,&primData,ddl_int32);
        }
        else {
          bVar2 = isFloat<char>(pcVar3,end);
          if (bVar2) {
            in = parseFloatingLiteral(pcVar3,end,&primData,ddl_float);
          }
          else {
            if (*pcVar3 != '\"') {
              names.super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              names.super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              names.super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              pcVar3 = parseReference(pcVar3,end,&names);
              ppNVar1 = names.
                        super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
              names_00 = names.
                         super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              if (names.super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>.
                  _M_impl.super__Vector_impl_data._M_start !=
                  names.super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
                this_00 = (Reference *)operator_new(0x10);
                Reference::Reference(this_00,(long)ppNVar1 - (long)names_00 >> 3,names_00);
                this_01 = (Property *)operator_new(0x20);
                Property::Property(this_01,this);
                *prop = this_01;
                this_01->m_ref = this_00;
              }
              std::_Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>::
              ~_Vector_base(&names.
                             super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>
                           );
              return pcVar3;
            }
            in = parseStringLiteral(pcVar3,end,&primData);
          }
        }
        createPropertyWithData(this,primData,prop);
      }
      else {
        Text::~Text(this);
        operator_delete(this,0x18);
      }
    }
  }
  return in;
}

Assistant:

char *OpenDDLParser::parseProperty( char *in, char *end, Property **prop ) {
    *prop = ddl_nullptr;
    if( ddl_nullptr == in || in == end ) {
        return in;
    }

    in = lookForNextToken( in, end );
    Text *id( ddl_nullptr );
    in = parseIdentifier( in, end, &id );
    if( ddl_nullptr != id ) {
        in = lookForNextToken( in, end );
        if( *in == '=' ) {
            ++in;
            in = getNextToken( in, end );
            Value *primData( ddl_nullptr );
            if( isInteger( in, end ) ) {
                in = parseIntegerLiteral( in, end, &primData );
                createPropertyWithData( id, primData, prop );
            } else if( isFloat( in, end ) ) {
                in = parseFloatingLiteral( in, end, &primData );
                createPropertyWithData( id, primData, prop );
            } else if( isStringLiteral( *in ) ) { // string data
                in = parseStringLiteral( in, end, &primData );
                createPropertyWithData( id, primData, prop );
            } else {                              // reference data
                std::vector<Name*> names;
                in = parseReference( in, end, names );
                if( !names.empty() ) {
                    Reference *ref = new Reference( names.size(), &names[ 0 ] );
                    ( *prop ) = new Property( id );
                    ( *prop )->m_ref = ref;
                }
            }
        } else {
            delete id;
        }
    }

    return in;
}